

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Gia_ManCompareWithBest
              (Gia_Man_t *pBest,Gia_Man_t *p,int *pnBestLuts,int *pnBestEdges,int *pnBestLevels,
              int fArea)

{
  int iVar1;
  int iVar2;
  char *__s1;
  char *__s2;
  int local_48;
  int local_44;
  int nCurLevels;
  int nCurEdges;
  int nCurLuts;
  int fArea_local;
  int *pnBestLevels_local;
  int *pnBestEdges_local;
  int *pnBestLuts_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pBest_local;
  
  nCurEdges = fArea;
  _nCurLuts = pnBestLevels;
  pnBestLevels_local = pnBestEdges;
  pnBestEdges_local = pnBestLuts;
  pnBestLuts_local = (int *)p;
  p_local = pBest;
  Gia_ManLutParams(p,&nCurLevels,&local_44,&local_48);
  if (p_local != (Gia_Man_t *)0x0) {
    iVar1 = Gia_ManPiNum(p_local);
    iVar2 = Gia_ManPiNum((Gia_Man_t *)pnBestLuts_local);
    if (iVar1 == iVar2) {
      iVar1 = Gia_ManPoNum(p_local);
      iVar2 = Gia_ManPoNum((Gia_Man_t *)pnBestLuts_local);
      if (iVar1 == iVar2) {
        iVar1 = Gia_ManRegNum(p_local);
        iVar2 = Gia_ManRegNum((Gia_Man_t *)pnBestLuts_local);
        if (iVar1 == iVar2) {
          __s1 = Gia_ManName(p_local);
          __s2 = Gia_ManName((Gia_Man_t *)pnBestLuts_local);
          iVar1 = strcmp(__s1,__s2);
          if (((iVar1 == 0) &&
              ((nCurEdges != 0 ||
               ((*_nCurLuts <= local_48 &&
                ((*_nCurLuts != local_48 ||
                 (*pnBestEdges_local * 2 + *pnBestLevels_local <= nCurLevels * 2 + local_44))))))))
             && ((nCurEdges == 0 ||
                 ((*pnBestEdges_local <= nCurLevels &&
                  ((*pnBestEdges_local != nCurLevels || (*_nCurLuts <= local_48)))))))) {
            return 0;
          }
        }
      }
    }
  }
  *pnBestEdges_local = nCurLevels;
  *pnBestLevels_local = local_44;
  *_nCurLuts = local_48;
  return 1;
}

Assistant:

static inline int Gia_ManCompareWithBest( Gia_Man_t * pBest, Gia_Man_t * p, int * pnBestLuts, int * pnBestEdges, int * pnBestLevels, int fArea )
{
    int nCurLuts, nCurEdges, nCurLevels;
    Gia_ManLutParams( p, &nCurLuts, &nCurEdges, &nCurLevels );
    if ( pBest == NULL ||
         Gia_ManPiNum(pBest) != Gia_ManPiNum(p) ||
         Gia_ManPoNum(pBest) != Gia_ManPoNum(p) ||
         Gia_ManRegNum(pBest) != Gia_ManRegNum(p) ||
         strcmp(Gia_ManName(pBest), Gia_ManName(p)) ||
         (!fArea && (*pnBestLevels > nCurLevels || (*pnBestLevels == nCurLevels && 2*(*pnBestLuts) + *pnBestEdges > 2*nCurLuts + nCurEdges))) ||
         ( fArea && (*pnBestLuts   > nCurLuts   || (*pnBestLuts   == nCurLuts   && *pnBestLevels > nCurLevels)))
       )
    {
        *pnBestLuts = nCurLuts;
        *pnBestEdges = nCurEdges;
        *pnBestLevels = nCurLevels;
        //printf( "\nUpdating best (%d %d %d).\n\n", nCurLuts, nCurEdges, nCurLevels );
        return 1;
    }
    return 0;
}